

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O1

void __thiscall getCommandList::test_method(getCommandList *this)

{
  int iVar1;
  string *psVar2;
  char *pcVar3;
  undefined8 **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  char **local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined8 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 local_98 [8];
  undefined8 local_90;
  shared_count sStack_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  char **local_38;
  
  psVar2 = (string *)dynamicgraph::PoolStorage::getInstance();
  local_e8 = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"my-entity","");
  dynamicgraph::PoolStorage::getEntity(psVar2);
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,(long)local_d8 + 1);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0xb8);
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_00133920;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  pcVar3 = (char *)dynamicgraph::Entity::getCommandList_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare(pcVar3);
  local_98[0] = iVar1 == 0;
  local_90 = 0;
  sStack_88.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
  ;
  local_58 = "";
  local_d0 = &local_a0;
  local_e0 = 0;
  local_e8 = (undefined8 **)&PTR__lazy_ostream_00133a58;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_38 = &local_a8;
  local_a8 = "print\nsignals\nsignalDep";
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_00133c18;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = pcVar3;
  boost::test_tools::tt_detail::report_assertion
            (local_98,&local_c8,&local_60,0xb8,1,2,2,"entity.getCommandList()",&local_e8,
             "\"print\\nsignals\\nsignalDep\"",&local_50);
  boost::detail::shared_count::~shared_count(&sStack_88);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(getCommandList) {
  dynamicgraph::Entity &entity =
      dynamicgraph::PoolStorage::getInstance()->getEntity("my-entity");

  BOOST_CHECK_EQUAL(entity.getCommandList(), "print\nsignals\nsignalDep");
}